

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleParallelAnalyzerSettings.cpp
# Opt level: O0

void __thiscall
SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings(SimpleParallelAnalyzerSettings *this)

{
  Channel *pCVar1;
  size_type sVar2;
  reference ppAVar3;
  pointer pAVar4;
  uint local_18;
  U32 i;
  U32 count;
  SimpleParallelAnalyzerSettings *this_local;
  
  sVar2 = std::vector<Channel,_std::allocator<Channel>_>::size(&this->mDataChannels);
  for (local_18 = 0; local_18 < (uint)sVar2; local_18 = local_18 + 1) {
    ppAVar3 = std::
              vector<AnalyzerSettingInterfaceChannel_*,_std::allocator<AnalyzerSettingInterfaceChannel_*>_>
              ::operator[](&this->mDataChannelsInterface,(ulong)local_18);
    pCVar1 = (Channel *)*ppAVar3;
    std::vector<Channel,_std::allocator<Channel>_>::operator[](&this->mDataChannels,(ulong)local_18)
    ;
    AnalyzerSettingInterfaceChannel::SetChannel(pCVar1);
  }
  pAVar4 = std::
           unique_ptr<AnalyzerSettingInterfaceChannel,_std::default_delete<AnalyzerSettingInterfaceChannel>_>
           ::operator->(&this->mClockChannelInterface);
  AnalyzerSettingInterfaceChannel::SetChannel((Channel *)pAVar4);
  std::
  unique_ptr<AnalyzerSettingInterfaceNumberList,_std::default_delete<AnalyzerSettingInterfaceNumberList>_>
  ::operator->(&this->mClockEdgeInterface);
  AnalyzerSettingInterfaceNumberList::SetNumber((double)(int)this->mClockEdge);
  return;
}

Assistant:

void SimpleParallelAnalyzerSettings::UpdateInterfacesFromSettings()
{
    U32 count = mDataChannels.size();
    for( U32 i = 0; i < count; i++ )
    {
        mDataChannelsInterface[ i ]->SetChannel( mDataChannels[ i ] );
    }

    mClockChannelInterface->SetChannel( mClockChannel );
    mClockEdgeInterface->SetNumber( static_cast<double>( mClockEdge ) );
}